

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O3

xml_attribute __thiscall
pugi::xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
          (xml_node *this,namespace_uri_predicate pred)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  char cVar5;
  xml_attribute local_38;
  xml_attribute local_30;
  
  sVar2 = pred.prefix_length;
  if (this != (xml_node *)0x0) {
    xml_attribute::xml_attribute(&local_30,(xml_attribute_struct *)this[7]._root);
    local_38._attr = local_30._attr;
    if (local_30._attr != (xml_attribute_struct *)0x0) {
      do {
        pcVar1 = (local_30._attr)->name;
        if (pcVar1 == (char *)0x0) {
          pcVar1 = "";
        }
        cVar5 = 'x';
        lVar3 = 0;
        do {
          if (pcVar1[lVar3] != cVar5) goto LAB_007022e2;
          cVar5 = "xmlns"[lVar3 + 1];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 5);
        cVar5 = pcVar1[5];
        if (pred.prefix == (char_t *)0x0) {
joined_r0x007022e0:
          if (cVar5 == '\0') {
            return (xml_attribute)local_30._attr;
          }
        }
        else if (cVar5 == ':') {
          if (sVar2 != 0) {
            sVar4 = 0;
            do {
              if (pcVar1[sVar4 + 6] != pred.prefix[sVar4]) goto LAB_007022e2;
              sVar4 = sVar4 + 1;
            } while (sVar2 != sVar4);
          }
          cVar5 = pcVar1[sVar2 + 6];
          goto joined_r0x007022e0;
        }
LAB_007022e2:
        xml_attribute::xml_attribute(&local_30,(local_30._attr)->next_attribute);
        local_38._attr = local_30._attr;
      } while (local_30._attr != (xml_attribute_struct *)0x0);
    }
  }
  xml_attribute::xml_attribute(&local_38);
  return (xml_attribute)local_38._attr;
}

Assistant:

xml_attribute find_attribute(Predicate pred) const
		{
			if (!_root) return xml_attribute();

			for (xml_attribute attrib = first_attribute(); attrib; attrib = attrib.next_attribute())
				if (pred(attrib))
					return attrib;

			return xml_attribute();
		}